

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void welcome_message(int n_nums,int duration)

{
  puts("Welcome to the \x1b[93mmemory test v1.0\x1b[0m!\n");
  printf("You will be given \x1b[96m%d numbers\x1b[0m and \x1b[96m%d seconds\x1b[0m for you to memorize them.\n"
         ,n_nums,duration);
  return;
}

Assistant:

void welcome_message(const int n_nums, const int duration) {
  printf("Welcome to the " ANSI_COLOR_YELLOW "memory test v1.0" ANSI_COLOR_NONE "!\n\n");

  printf(
    "You will be given "
    ANSI_COLOR_CYAN "%d numbers" ANSI_COLOR_NONE
    " and " ANSI_COLOR_CYAN "%d seconds" ANSI_COLOR_NONE
    " for you to memorize them.\n",
    n_nums,
    duration
  );
}